

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O2

FT_Error ps_dimension_set_mask_bits
                   (PS_Dimension dim,FT_Byte *source,FT_UInt source_pos,FT_UInt source_bits,
                   FT_UInt end_point,FT_Memory memory)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  FT_Error FVar4;
  byte *pbVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  byte *pbVar9;
  bool bVar10;
  PS_Mask mask;
  PS_Mask local_30;
  
  FVar4 = ps_dimension_reset_mask(dim,end_point,memory);
  if (FVar4 == 0) {
    FVar4 = ps_mask_table_last(&dim->masks,memory,&local_30);
    if (FVar4 == 0) {
      FVar4 = ps_mask_ensure(local_30,source_bits,memory);
      if (FVar4 == 0) {
        local_30->num_bits = source_bits;
        pbVar9 = source + (source_pos >> 3);
        pbVar5 = local_30->bytes;
        uVar6 = 0x80 >> ((byte)source_pos & 7);
        uVar8 = 0x80;
        while (bVar10 = source_bits != 0, source_bits = source_bits - 1, bVar10) {
          uVar2 = (int)uVar8 >> 1;
          if (uVar8 < 2) {
            uVar2 = 0x80;
          }
          bVar1 = *pbVar9;
          pbVar9 = pbVar9 + (uVar6 < 2);
          uVar3 = uVar6 >> 1;
          if (uVar6 < 2) {
            uVar3 = 0x80;
          }
          bVar7 = (byte)uVar8 | *pbVar5;
          if ((uVar6 & bVar1) == 0) {
            bVar7 = ~(byte)uVar8 & *pbVar5;
          }
          *pbVar5 = bVar7;
          pbVar5 = pbVar5 + (uVar8 < 2);
          uVar6 = uVar3;
          uVar8 = uVar2;
        }
        FVar4 = 0;
      }
    }
  }
  return FVar4;
}

Assistant:

static FT_Error
  ps_dimension_set_mask_bits( PS_Dimension    dim,
                              const FT_Byte*  source,
                              FT_UInt         source_pos,
                              FT_UInt         source_bits,
                              FT_UInt         end_point,
                              FT_Memory       memory )
  {
    FT_Error  error;


    /* reset current mask, if any */
    error = ps_dimension_reset_mask( dim, end_point, memory );
    if ( error )
      goto Exit;

    /* set bits in new mask */
    error = ps_mask_table_set_bits( &dim->masks, source,
                                    source_pos, source_bits, memory );

  Exit:
    return error;
  }